

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint generateFixedDistanceTree(HuffmanTree *tree)

{
  uint extraout_EAX;
  undefined1 (*bitlen) [64];
  undefined1 auVar1 [64];
  
  bitlen = (undefined1 (*) [64])malloc(0x80);
  if (bitlen != (undefined1 (*) [64])0x0) {
    auVar1 = vbroadcastss_avx512f(ZEXT416(5));
    *bitlen = auVar1;
    bitlen[1] = auVar1;
    HuffmanTree_makeFromLengths(tree,(uint *)bitlen,0x20,0xf);
    free(bitlen);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

static unsigned generateFixedDistanceTree(HuffmanTree* tree)
{
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
  if(!bitlen) return 83; /*alloc fail*/

  /*there are 32 distance codes, but 30-31 are unused*/
  for(i = 0; i != NUM_DISTANCE_SYMBOLS; ++i) bitlen[i] = 5;
  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DISTANCE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}